

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar4;
  options_description *poVar5;
  basic_command_line_parser<char> *pbVar6;
  size_type sVar7;
  ostream *poVar8;
  variable_value *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  path *ppVar11;
  string_type *psVar12;
  exception *e;
  key_type local_b28;
  allocator<char> local_b01;
  string local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  undefined1 local_a18 [8];
  string dot_cmd;
  ofstream os;
  allocator<char> local_7f1;
  string local_7f0;
  path local_7d0;
  undefined1 local_7b0 [8];
  path image_file_path;
  undefined1 local_770 [8];
  path dot_file_path;
  fsm_def sm;
  string local_6f8;
  undefined1 local_6d8 [8];
  path input_file_path;
  key_type local_6b0;
  allocator<char> local_689;
  key_type local_688;
  int local_668;
  allocator<char> local_661;
  key_type local_660;
  basic_command_line_parser<char> local_640;
  basic_parsed_options<char> local_5c8;
  positional_options_description local_5a0 [8];
  positional_options_description p;
  allocator<char> local_561;
  string local_560 [32];
  options_description local_540 [8];
  options_description visible;
  options_description local_4c0 [8];
  options_description config_file_options;
  options_description local_440 [8];
  options_description cmdline_options;
  undefined8 local_3c0;
  allocator<char> local_3b1;
  string local_3b0 [32];
  options_description local_390 [8];
  options_description hidden;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator<char> local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined8 local_248;
  allocator<char> local_239;
  string local_238 [32];
  options_description local_218 [8];
  options_description config;
  undefined8 local_198 [3];
  allocator<char> local_179;
  string local_178 [32];
  options_description local_158 [8];
  options_description basic;
  string local_d8 [8];
  string file_data;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a8 [144];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  boost::program_options::variables_map::variables_map
            ((variables_map *)(file_data.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"Basic options",&local_179);
  boost::program_options::options_description::options_description
            (local_158,local_178,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  local_198[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_198,"version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"Configuration",&local_239);
  boost::program_options::options_description::options_description
            (local_218,local_238,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  local_248 = boost::program_options::options_description::add_options();
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_269);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_268);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_248,(value_semantic *)"file,f",(char *)ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"dot-stdout");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"dot",&local_291);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_290);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"dot-path,dot",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2b9);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_2b8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output-dir,dir",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_2e0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"output,o",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"png",&local_309);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar3,&local_308);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"image-ext,ext",(char *)ptVar3);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"Hidden options",&local_3b1);
  boost::program_options::options_description::options_description
            (local_390,local_3b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  local_3c0 = boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_3c0,(value_semantic *)"dot-params",(char *)ptVar4);
  boost::program_options::options_description::options_description
            (local_440,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_440);
  poVar5 = (options_description *)boost::program_options::options_description::add(poVar5);
  boost::program_options::options_description::add(poVar5);
  boost::program_options::options_description::options_description
            (local_4c0,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_4c0);
  boost::program_options::options_description::add(poVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"Allowed options",&local_561);
  boost::program_options::options_description::options_description
            (local_540,local_560,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator(&local_561);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_540);
  boost::program_options::options_description::add(poVar5);
  boost::program_options::positional_options_description::positional_options_description(local_5a0);
  boost::program_options::positional_options_description::add((char *)local_5a0,0x13f228);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_640,(int)argv_local,local_18);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options(&local_640,local_440);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::positional(pbVar6,local_5a0);
  boost::program_options::basic_command_line_parser<char>::run(&local_5c8,pbVar6);
  boost::program_options::store
            ((basic_parsed_options *)&local_5c8,
             (variables_map *)(file_data.field_2._M_local_buf + 8),false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_5c8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_640);
  boost::program_options::notify((variables_map *)(file_data.field_2._M_local_buf + 8));
  boost::program_options::notify((variables_map *)(file_data.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"help",&local_661);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a8,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"version",&local_689);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a8,&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
    if (sVar7 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b0,"dot-params",
                 (allocator<char> *)(input_file_path.m_pathname.field_2._M_local_buf + 0xf));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::count(local_a8,&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(input_file_path.m_pathname.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f8,"file",
                 (allocator<char> *)
                 ((long)&sm.general_options.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pvVar9 = boost::program_options::variables_map::operator[]
                         ((variables_map *)(file_data.field_2._M_local_buf + 8),&local_6f8);
      pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
      boost::filesystem::path::path((path *)local_6d8,pbVar10);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&sm.general_options.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      fsm_from_file((fsm_def *)((long)&dot_file_path.m_pathname.field_2 + 8),(path *)local_6d8);
      boost::filesystem::path::path((path *)((long)&image_file_path.m_pathname.field_2 + 8),"gv");
      ppVar11 = (path *)boost::filesystem::path::replace_extension((path *)local_6d8);
      boost::filesystem::path::path((path *)local_770,ppVar11);
      boost::filesystem::path::~path((path *)((long)&image_file_path.m_pathname.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f0,"image-ext",&local_7f1);
      pvVar9 = boost::program_options::variables_map::operator[]
                         ((variables_map *)(file_data.field_2._M_local_buf + 8),&local_7f0);
      pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
      boost::filesystem::path::path(&local_7d0,pbVar10);
      ppVar11 = (path *)boost::filesystem::path::replace_extension((path *)local_6d8);
      boost::filesystem::path::path((path *)local_7b0,ppVar11);
      boost::filesystem::path::~path(&local_7d0);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
      poVar8 = std::operator<<((ostream *)&std::cout,"Writing dot file to: \'");
      psVar12 = boost::filesystem::path::native_abi_cxx11_((path *)local_770);
      poVar8 = std::operator<<(poVar8,(string *)psVar12);
      poVar8 = std::operator<<(poVar8,"\'");
      std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
      psVar12 = boost::filesystem::path::native_abi_cxx11_((path *)local_770);
      std::ofstream::ofstream((undefined1 *)((long)&dot_cmd.field_2 + 8),psVar12,0x10);
      poVar8 = operator<<((ostream *)(dot_cmd.field_2._M_local_buf + 8),
                          (fsm_def *)((long)&dot_file_path.m_pathname.field_2 + 8));
      std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
      std::ofstream::~ofstream((void *)((long)&dot_cmd.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"dot-path",&local_ad9)
      ;
      pvVar9 = boost::program_options::variables_map::operator[]
                         ((variables_map *)(file_data.field_2._M_local_buf + 8),&local_ad8);
      pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
      std::operator+(&local_ab8,pbVar10," -T");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b00,"image-ext",&local_b01);
      pvVar9 = boost::program_options::variables_map::operator[]
                         ((variables_map *)(file_data.field_2._M_local_buf + 8),&local_b00);
      pbVar10 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar9);
      std::operator+(&local_a98,&local_ab8,pbVar10);
      std::operator+(&local_a78,&local_a98," ");
      psVar12 = boost::filesystem::path::native_abi_cxx11_((path *)local_770);
      std::operator+(&local_a58,&local_a78,psVar12);
      std::operator+(&local_a38,&local_a58," -o ");
      psVar12 = boost::filesystem::path::native_abi_cxx11_((path *)local_7b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a18,
                     &local_a38,psVar12);
      std::__cxx11::string::~string((string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator(&local_b01);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
      poVar8 = std::operator<<((ostream *)&std::cout,"Running dot with following command:\n");
      poVar8 = std::operator<<(poVar8,(string *)local_a18);
      std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = system(pcVar2);
      if (iVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b28,"dot-stdout",(allocator<char> *)((long)&e + 7));
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_a8,&local_b28);
        std::__cxx11::string::~string((string *)&local_b28);
        std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
        if (sVar7 != 0) {
          poVar8 = operator<<((ostream *)&std::cout,
                              (fsm_def *)((long)&dot_file_path.m_pathname.field_2 + 8));
          std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
        }
        local_668 = 0;
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cout,"Error when running dot!");
        std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        local_668 = 1;
      }
      std::__cxx11::string::~string((string *)local_a18);
      boost::filesystem::path::~path((path *)local_7b0);
      boost::filesystem::path::~path((path *)local_770);
      fsm_def::~fsm_def((fsm_def *)((long)&dot_file_path.m_pathname.field_2 + 8));
      if (local_668 == 0) {
        local_668 = 0;
      }
      boost::filesystem::path::~path((path *)local_6d8);
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"fsm2dot version 1.0");
      std::ostream::operator<<((ostream *)poVar8,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
      local_668 = 1;
    }
  }
  else {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_540);
    std::operator<<(poVar8,"\n");
    argv_local._4_4_ = 0;
    local_668 = 1;
  }
  boost::program_options::positional_options_description::~positional_options_description(local_5a0)
  ;
  boost::program_options::options_description::~options_description(local_540);
  boost::program_options::options_description::~options_description(local_4c0);
  boost::program_options::options_description::~options_description(local_440);
  boost::program_options::options_description::~options_description(local_390);
  boost::program_options::options_description::~options_description(local_218);
  boost::program_options::options_description::~options_description(local_158);
  if (local_668 == 0) {
    argv_local._4_4_ = 0;
    local_668 = 1;
  }
  std::__cxx11::string::~string(local_d8);
  boost::program_options::variables_map::~variables_map
            ((variables_map *)(file_data.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    po::variables_map vm;
    using namespace std;

    std::string file_data;

    try {
        // Declare a group of options that will be allowed only on command line
        po::options_description basic("Basic options");
        basic.add_options()
                ("version,v",   "print version string")
                ("help,h",      "produce help message")
                ;

        // Declare a group of options that will be
        // allowed both on command line and in config file
        po::options_description config("Configuration");
        config.add_options()
                ("file,f", po::value<std::string>()->default_value(""), "C++ file with state machine definition")
                ("dot-stdout", "Write dot file also to stdout")
                ("dot-path,dot", po::value<std::string>()->default_value("dot"), "Full path (or name if in PATH) of the dot executable")
                ("output-dir,dir", po::value<std::string>()->default_value(""), "Output directory for dot and image file")
                ("output,o", po::value<std::string>()->default_value(""), "Output file name(s) for .dot file and image file")
                ("image-ext,ext", po::value<std::string>()->default_value("png"), "Image extension")
                ;

        // Hidden options, will be allowed both on command line and
        // in config file, but will not be shown to the user.
        // Hidden options are those without argument names (unanmed arguments).
        // In this case we use them for the php script to execute along
        // with the command line parameters for this script.
        po::options_description hidden("Hidden options");
        hidden.add_options()
                ("dot-params", po::value< std::vector<std::string> >(), "(Graphviz) dot parameters")
                ;


        po::options_description cmdline_options;
        cmdline_options.add(basic).add(config).add(hidden);

        po::options_description config_file_options;
        config_file_options.add(config).add(hidden);

        po::options_description visible("Allowed options");
        visible.add(basic).add(config);

        po::positional_options_description p;
        p.add("dot-params", -1);

        po::store(po::command_line_parser(argc, argv).options(cmdline_options).positional(p).run(), vm);
        po::notify(vm);

        notify(vm);

        if (vm.count("help")) {
            std::cout << visible << "\n";
            return 0;
        }

        if (vm.count("version")) {
            std::cout << "fsm2dot version 1.0" << std::endl;
            return 0;
        }

        // PHP miner script and parameters for this
        if (vm.count("dot-params")) {
        }

        auto input_file_path = boost::filesystem::path(vm["file"].as<std::string >());
        {
            fsm_def sm = fsm_from_file(input_file_path);

            const auto dot_file_path   = input_file_path.replace_extension("gv");
            const auto image_file_path = input_file_path.replace_extension(vm["image-ext"].as<std::string >());
            {
                std::cout << "Writing dot file to: '" << dot_file_path.native() << "'" << std::endl;
                std::ofstream os(dot_file_path.native());
                os << sm << std::endl;
            }
            std::string dot_cmd = vm["dot-path"].as<std::string >()
                    + " -T" + vm["image-ext"].as<std::string >()
                    + " " + dot_file_path.native()
                    + " -o " + image_file_path.native();

            std::cout << "Running dot with following command:\n" << dot_cmd << std::endl;
            // dot -Tpng fsm.gv -o myFiniteStateMachine.png

            if (std::system(dot_cmd.c_str()) != 0) {
                std::cout << "Error when running dot!" << std::endl;
                return 1;
            }
            if (vm.count("dot-stdout")) {
                std::cout << sm << std::endl;
            }
        }

    }
    catch(std::exception& e)
    {
        std::cout << "Error: Unknown arguments given:" << std::endl;
        std::cout << e.what() << "\n";
        return 1;
    }
    return 0;
}